

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

void __thiscall Js::ProbeContainer::RemoveAllProbes(ProbeContainer *this)

{
  List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  Type *ppPVar1;
  int i;
  int index;
  
  for (index = 0; this_00 = this->diagProbeList,
      index < (this_00->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count; index = index + 1) {
    ppPVar1 = JsUtil::
              List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,index);
    (*((*ppPVar1)->super_HaltCallback)._vptr_HaltCallback[6])(*ppPVar1,0);
  }
  (this_00->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  return;
}

Assistant:

void ProbeContainer::RemoveAllProbes()
    {
#ifdef ENABLE_MUTATION_BREAKPOINT
        if (HasMutationBreakpoints())
        {
            ClearMutationBreakpoints();
        }
#endif
        for (int i = 0; i < diagProbeList->Count(); i++)
        {
            diagProbeList->Item(i)->Uninstall(nullptr);
        }
        diagProbeList->Clear();
    }